

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test::
testBody(TEST_MockReturnValueTest_LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  undefined4 extraout_var_01;
  long lVar5;
  TestTerminator *pTVar6;
  undefined4 extraout_var_02;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  MockNamedValue local_60;
  
  SimpleString::SimpleString((SimpleString *)&local_60,"");
  pMVar2 = mock((SimpleString *)&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_90);
  SimpleString::SimpleString(&local_80,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_80,1);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x48))(plVar3);
  (**(code **)(*plVar3 + 0xd8))(plVar3,1);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  SimpleString::SimpleString((SimpleString *)&local_60,"");
  pMVar2 = mock((SimpleString *)&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_90);
  SimpleString::SimpleString(&local_80,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_80,1);
  plVar3 = (long *)(**(code **)(*plVar3 + 0x48))(plVar3);
  (**(code **)(*plVar3 + 0xd8))(plVar3,2);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString((SimpleString *)&local_60);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_80);
  SimpleString::SimpleString(&local_70,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_01,iVar1),&local_70,1);
  (**(code **)(*plVar3 + 0xa8))(&local_60,plVar3);
  lVar5 = MockNamedValue::getLongIntValue(&local_60);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,1,lVar5,
             "LONGS_EQUAL(ret_value, mock().actualCall(\"foo\").withParameter(\"p1\", 1).returnValue().getLongIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1db,pTVar6);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_90);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[8])(&local_60,pMVar2);
  lVar5 = MockNamedValue::getLongIntValue(&local_60);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,1,lVar5,"LONGS_EQUAL(ret_value, mock().returnValue().getLongIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1dc,pTVar6);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_90);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_80,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_80);
  SimpleString::SimpleString(&local_70,"p1");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x40))
                             ((long *)CONCAT44(extraout_var_02,iVar1),&local_70,1);
  (**(code **)(*plVar3 + 0xa8))(&local_60,plVar3);
  lVar5 = MockNamedValue::getLongIntValue(&local_60);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,2,lVar5,
             "LONGS_EQUAL(another_ret_value, mock().actualCall(\"foo\").withParameter(\"p1\", 1).returnValue().getLongIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1dd,pTVar6);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_80);
  SimpleString::~SimpleString(&local_90);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_90,"");
  pMVar2 = mock(&local_90,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[8])(&local_60,pMVar2);
  lVar5 = MockNamedValue::getLongIntValue(&local_60);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,2,lVar5,
             "LONGS_EQUAL(another_ret_value, mock().returnValue().getLongIntValue()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x1de,pTVar6);
  MockNamedValue::~MockNamedValue(&local_60);
  SimpleString::~SimpleString(&local_90);
  return;
}

Assistant:

TEST(MockReturnValueTest, LongIntegerReturnValueSetsDifferentValuesWhileParametersAreIgnored)
{
    long int ret_value = 1;
    long int another_ret_value = 2;

    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(ret_value);
    mock().expectOneCall("foo").withParameter("p1", 1).ignoreOtherParameters().andReturnValue(another_ret_value);

    LONGS_EQUAL(ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongIntValue());
    LONGS_EQUAL(ret_value, mock().returnValue().getLongIntValue());
    LONGS_EQUAL(another_ret_value, mock().actualCall("foo").withParameter("p1", 1).returnValue().getLongIntValue());
    LONGS_EQUAL(another_ret_value, mock().returnValue().getLongIntValue());
}